

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACLoader.h
# Opt level: O2

void __thiscall Assimp::AC3DImporter::Object::~Object(Object *this)

{
  std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>::
  ~vector(&this->surfaces);
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
            (&(this->vertices).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
  std::__cxx11::string::~string((string *)&this->texture);
  std::vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>::~vector
            (&this->children);
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

Object()
            :   type    (World)
            ,   name( "" )
            ,   children()
            ,   texture( "" )
            ,   texRepeat( 1.f, 1.f )
            ,   texOffset( 0.0f, 0.0f )
            ,   rotation()
            ,   translation()
            ,   vertices()
            ,   surfaces()
            ,   numRefs (0)
            ,   subDiv  (0)
            ,   crease()
        {}